

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFlushFinishTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::FlushFinishCase::render
          (FlushFinishCase *this,int numDrawCalls)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  deUint8 indices [6];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x188))(0x4500);
  iVar2 = 0;
  if (0 < numDrawCalls) {
    iVar2 = numDrawCalls;
  }
  while (iVar2 != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x568))(4,6,0x1401,indices);
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void FlushFinishCase::render (int numDrawCalls)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();

	const deUint8 indices[] = { 0, 1, 2, 2, 1, 3 };

	gl.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	for (int ndx = 0; ndx < numDrawCalls; ndx++)
		gl.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_BYTE, &indices[0]);
}